

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O1

void __thiscall trng::yarn4::split(yarn4 *this,uint s,uint n)

{
  uint i_7;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint i;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  int32_t b [16];
  int32_t a [4];
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_88,"invalid argument for trng::yarn4::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_88);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_88);
  }
  if (1 < s) {
    uVar11 = (ulong)n + 1;
    if (n < 0xf) {
      iVar2 = (this->S).r[0];
      iVar1 = (this->S).r[1];
      iVar16 = (this->S).r[2];
      iVar13 = (this->S).r[3];
      do {
        iVar9 = iVar16;
        iVar16 = iVar1;
        iVar1 = iVar2;
        uVar14 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar9 * (long)(this->P).a[2] +
                 (long)iVar16 * (long)(this->P).a[1] + (long)iVar1 * (long)(this->P).a[0];
        uVar15 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar15 - 0x1fffffffc;
        if (uVar15 < 0x1fffffffc) {
          uVar14 = uVar15;
        }
        uVar15 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar15 = uVar14;
        }
        iVar2 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar2 = (int)uVar15;
        }
        uVar10 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar10;
        iVar13 = iVar9;
      } while (uVar10 != 0);
      (this->S).r[0] = iVar2;
      (this->S).r[1] = iVar1;
      (this->S).r[2] = iVar16;
      (this->S).r[3] = iVar9;
    }
    else {
      uVar10 = 0;
      do {
        if ((uVar11 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar11;
        uVar11 = uVar11 >> 1;
      } while (bVar19);
    }
    iVar2 = (this->S).r[0];
    uVar11 = (ulong)s;
    if (s < 0x10) {
      iVar3 = s + (s == 0);
      iVar1 = iVar2;
      iVar16 = (this->S).r[1];
      iVar13 = (this->S).r[2];
      iVar9 = (this->S).r[3];
      do {
        iVar4 = iVar13;
        iVar13 = iVar16;
        iVar16 = iVar1;
        uVar14 = (long)iVar9 * (long)(this->P).a[3] + (long)iVar4 * (long)(this->P).a[2] +
                 (long)iVar13 * (long)(this->P).a[1] + (long)iVar16 * (long)(this->P).a[0];
        uVar15 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar15 - 0x1fffffffc;
        if (uVar15 < 0x1fffffffc) {
          uVar14 = uVar15;
        }
        uVar15 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar15 = uVar14;
        }
        iVar1 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar1 = (int)uVar15;
        }
        iVar3 = iVar3 + -1;
        iVar9 = iVar4;
      } while (iVar3 != 0);
      (this->S).r[0] = iVar1;
      (this->S).r[1] = iVar16;
      (this->S).r[2] = iVar13;
      (this->S).r[3] = iVar4;
    }
    else {
      uVar10 = 0;
      uVar14 = uVar11;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar19);
    }
    iVar1 = (this->S).r[0];
    if (s < 0x10) {
      iVar4 = s + (s == 0);
      iVar16 = (this->S).r[1];
      iVar13 = iVar1;
      iVar9 = (this->S).r[2];
      iVar3 = (this->S).r[3];
      do {
        iVar6 = iVar9;
        iVar5 = iVar13;
        iVar9 = iVar16;
        uVar14 = (long)iVar3 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar9 * (long)(this->P).a[1] + (long)iVar5 * (long)(this->P).a[0];
        uVar15 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar15 - 0x1fffffffc;
        if (uVar15 < 0x1fffffffc) {
          uVar14 = uVar15;
        }
        uVar15 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar15 = uVar14;
        }
        iVar13 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar13 = (int)uVar15;
        }
        iVar4 = iVar4 + -1;
        iVar16 = iVar5;
        iVar3 = iVar6;
      } while (iVar4 != 0);
      (this->S).r[0] = iVar13;
      (this->S).r[1] = iVar5;
      (this->S).r[2] = iVar9;
      (this->S).r[3] = iVar6;
    }
    else {
      uVar10 = 0;
      uVar14 = uVar11;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar19);
    }
    iVar16 = (this->S).r[0];
    if (s < 0x10) {
      iVar5 = s + (s == 0);
      iVar13 = (this->S).r[1];
      iVar9 = (this->S).r[2];
      iVar3 = (this->S).r[3];
      iVar4 = iVar16;
      do {
        iVar6 = iVar4;
        iVar7 = iVar9;
        iVar9 = iVar13;
        uVar14 = (long)iVar3 * (long)(this->P).a[3] + (long)iVar7 * (long)(this->P).a[2] +
                 (long)iVar9 * (long)(this->P).a[1] + (long)iVar6 * (long)(this->P).a[0];
        uVar15 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar15 - 0x1fffffffc;
        if (uVar15 < 0x1fffffffc) {
          uVar14 = uVar15;
        }
        uVar15 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar15 = uVar14;
        }
        iVar4 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar4 = (int)uVar15;
        }
        iVar5 = iVar5 + -1;
        iVar13 = iVar6;
        iVar3 = iVar7;
      } while (iVar5 != 0);
      (this->S).r[0] = iVar4;
      (this->S).r[1] = iVar6;
      (this->S).r[2] = iVar9;
      (this->S).r[3] = iVar7;
    }
    else {
      uVar10 = 0;
      uVar14 = uVar11;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar19);
    }
    iVar13 = (this->S).r[0];
    if (s < 0x10) {
      iVar6 = s + (s == 0);
      iVar9 = (this->S).r[1];
      iVar3 = (this->S).r[2];
      iVar4 = (this->S).r[3];
      iVar5 = iVar13;
      do {
        iVar7 = iVar5;
        iVar8 = iVar3;
        iVar3 = iVar9;
        uVar14 = (long)iVar4 * (long)(this->P).a[3] + (long)iVar8 * (long)(this->P).a[2] +
                 (long)iVar3 * (long)(this->P).a[1] + (long)iVar7 * (long)(this->P).a[0];
        uVar15 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar15 - 0x1fffffffc;
        if (uVar15 < 0x1fffffffc) {
          uVar14 = uVar15;
        }
        uVar15 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar15 = uVar14;
        }
        iVar5 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar5 = (int)uVar15;
        }
        iVar6 = iVar6 + -1;
        iVar9 = iVar7;
        iVar4 = iVar8;
      } while (iVar6 != 0);
      (this->S).r[0] = iVar5;
      (this->S).r[1] = iVar7;
      (this->S).r[2] = iVar3;
      (this->S).r[3] = iVar8;
    }
    else {
      uVar10 = 0;
      uVar14 = uVar11;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar19);
    }
    iVar9 = (this->S).r[0];
    if (s < 0x10) {
      iVar7 = s + (s == 0);
      iVar3 = (this->S).r[1];
      iVar4 = (this->S).r[2];
      iVar5 = (this->S).r[3];
      iVar6 = iVar9;
      do {
        iVar8 = iVar6;
        iVar12 = iVar4;
        iVar4 = iVar3;
        uVar14 = (long)iVar5 * (long)(this->P).a[3] + (long)iVar12 * (long)(this->P).a[2] +
                 (long)iVar4 * (long)(this->P).a[1] + (long)iVar8 * (long)(this->P).a[0];
        uVar15 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar15 - 0x1fffffffc;
        if (uVar15 < 0x1fffffffc) {
          uVar14 = uVar15;
        }
        uVar15 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar15 = uVar14;
        }
        iVar6 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar6 = (int)uVar15;
        }
        iVar7 = iVar7 + -1;
        iVar3 = iVar8;
        iVar5 = iVar12;
      } while (iVar7 != 0);
      (this->S).r[0] = iVar6;
      (this->S).r[1] = iVar8;
      (this->S).r[2] = iVar4;
      (this->S).r[3] = iVar12;
    }
    else {
      uVar10 = 0;
      uVar14 = uVar11;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar19);
    }
    iVar3 = (this->S).r[0];
    if (s < 0x10) {
      iVar8 = s + (s == 0);
      iVar4 = (this->S).r[1];
      iVar5 = (this->S).r[2];
      iVar6 = (this->S).r[3];
      iVar7 = iVar3;
      do {
        iVar12 = iVar7;
        iVar17 = iVar5;
        iVar5 = iVar4;
        uVar14 = (long)iVar6 * (long)(this->P).a[3] + (long)iVar17 * (long)(this->P).a[2] +
                 (long)iVar5 * (long)(this->P).a[1] + (long)iVar12 * (long)(this->P).a[0];
        uVar15 = (uVar14 >> 0x1f) + (uVar14 & 0x7fffffff);
        uVar14 = uVar15 - 0x1fffffffc;
        if (uVar15 < 0x1fffffffc) {
          uVar14 = uVar15;
        }
        uVar15 = uVar14 - 0xfffffffe;
        if (uVar14 < 0xfffffffe) {
          uVar15 = uVar14;
        }
        iVar7 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar7 = (int)uVar15;
        }
        iVar8 = iVar8 + -1;
        iVar4 = iVar12;
        iVar6 = iVar17;
      } while (iVar8 != 0);
      (this->S).r[0] = iVar7;
      (this->S).r[1] = iVar12;
      (this->S).r[2] = iVar5;
      (this->S).r[3] = iVar17;
    }
    else {
      uVar10 = 0;
      uVar14 = uVar11;
      do {
        if ((uVar14 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar14;
        uVar14 = uVar14 >> 1;
      } while (bVar19);
    }
    iVar4 = (this->S).r[0];
    if (s < 0x10) {
      iVar12 = s + (s == 0);
      iVar5 = (this->S).r[1];
      iVar6 = (this->S).r[2];
      iVar7 = (this->S).r[3];
      iVar8 = iVar4;
      do {
        iVar17 = iVar8;
        iVar18 = iVar6;
        iVar6 = iVar5;
        uVar11 = (long)iVar7 * (long)(this->P).a[3] + (long)iVar18 * (long)(this->P).a[2] +
                 (long)iVar6 * (long)(this->P).a[1] + (long)iVar17 * (long)(this->P).a[0];
        uVar14 = (uVar11 >> 0x1f) + (uVar11 & 0x7fffffff);
        uVar11 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar11 = uVar14;
        }
        uVar14 = uVar11 - 0xfffffffe;
        if (uVar11 < 0xfffffffe) {
          uVar14 = uVar11;
        }
        iVar8 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar8 = (int)uVar14;
        }
        iVar12 = iVar12 + -1;
        iVar5 = iVar17;
        iVar7 = iVar18;
      } while (iVar12 != 0);
      (this->S).r[0] = iVar8;
      (this->S).r[1] = iVar17;
      (this->S).r[2] = iVar6;
      (this->S).r[3] = iVar18;
    }
    else {
      uVar10 = 0;
      do {
        if ((uVar11 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar19 = 1 < uVar11;
        uVar11 = uVar11 >> 1;
      } while (bVar19);
    }
    iStack_3c = (this->S).r[0];
    local_88 = iVar13;
    local_84 = iVar16;
    local_80 = iVar1;
    local_7c = iVar2;
    local_78 = iVar9;
    local_74 = iVar13;
    local_70 = iVar16;
    local_6c = iVar1;
    local_68 = iVar3;
    local_64 = iVar9;
    local_60 = iVar13;
    local_5c = iVar16;
    local_58 = iVar4;
    local_54 = iVar3;
    local_50 = iVar9;
    local_4c = iVar13;
    local_48 = iVar9;
    iStack_44 = iVar3;
    iStack_40 = iVar4;
    int_math::gauss<4>((int32_t (*) [16])&local_88,(int32_t (*) [4])&local_48,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(iStack_44,local_48);
    *(ulong *)((this->P).a + 2) = CONCAT44(iStack_3c,iStack_40);
    (this->S).r[0] = iVar13;
    (this->S).r[1] = iVar16;
    (this->S).r[2] = iVar1;
    (this->S).r[3] = iVar2;
    iVar2 = 4;
    do {
      backward(this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn4::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      int32_t a[4], b[16];
      a[0] = q4;
      b[0] = q3;
      b[1] = q2;
      b[2] = q1;
      b[3] = q0;
      a[1] = q5;
      b[4] = q4;
      b[5] = q3;
      b[6] = q2;
      b[7] = q1;
      a[2] = q6;
      b[8] = q5;
      b[9] = q4;
      b[10] = q3;
      b[11] = q2;
      a[3] = q7;
      b[12] = q6;
      b[13] = q5;
      b[14] = q4;
      b[15] = q3;
      int_math::gauss<4>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      S.r[0] = q3;
      S.r[1] = q2;
      S.r[2] = q1;
      S.r[3] = q0;
      for (int i{0}; i < 4; ++i)
        backward();
    }
  }